

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  int iVar3;
  TValue *t_00;
  TValue *local_90;
  TValue *io_2;
  lua_Integer *data_1;
  uint ukey_1;
  TValue *io_1;
  lua_Number *data;
  uint ukey;
  RaviArray *h;
  TValue *io;
  TValue *io2;
  TValue *io1;
  TValue *slot;
  StkId t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  iVar3 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar3 + 1;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2a8,"int lua_geti(lua_State *, int, lua_Integer)");
  }
  t_00 = index2addr(L,idx);
  if ((t_00->tt_ == 0x8005) || ((t_00->tt_ & 0xf) != 5)) {
    if ((t_00->tt_ & 0xf) == 5) {
      if (t_00->tt_ != 0x8005) {
        __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2ab,"int lua_geti(lua_State *, int, lua_Integer)");
      }
      if (((t_00->value_).gc)->tt != '\x05') {
        __assert_fail("(((t)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2ab,"int lua_geti(lua_State *, int, lua_Integer)");
      }
      if (n - 1U < (ulong)*(uint *)((t_00->value_).f + 0xc)) {
        if (t_00->tt_ != 0x8005) {
          __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2ab,"int lua_geti(lua_State *, int, lua_Integer)");
        }
        if (((t_00->value_).gc)->tt != '\x05') {
          __assert_fail("(((t)->value_).gc)->tt == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2ab,"int lua_geti(lua_State *, int, lua_Integer)");
        }
        local_90 = (TValue *)(*(long *)((t_00->value_).f + 0x10) + (n + -1) * 0x10);
      }
      else {
        if (t_00->tt_ != 0x8005) {
          __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2ab,"int lua_geti(lua_State *, int, lua_Integer)");
        }
        if (((t_00->value_).gc)->tt != '\x05') {
          __assert_fail("(((t)->value_).gc)->tt == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2ab,"int lua_geti(lua_State *, int, lua_Integer)");
        }
        local_90 = luaH_getint((Table *)(t_00->value_).gc,n);
      }
      io1 = local_90;
      if (local_90->tt_ != 0) {
        pTVar1 = L->top;
        pTVar1->value_ = local_90->value_;
        pTVar1->tt_ = local_90->tt_;
        if ((pTVar1->tt_ & 0x8000) != 0) {
          if ((pTVar1->tt_ & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x2ac,"int lua_geti(lua_State *, int, lua_Integer)");
          }
          if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00111de9:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x2ac,"int lua_geti(lua_State *, int, lua_Integer)");
          }
          if (L != (lua_State *)0x0) {
            if ((pTVar1->tt_ & 0x8000) == 0) {
              __assert_fail("(((io1)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x2ac,"int lua_geti(lua_State *, int, lua_Integer)");
            }
            if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
            goto LAB_00111de9;
          }
        }
        L->top = L->top + 1;
        if (L->ci->top < L->top) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2ad,"int lua_geti(lua_State *, int, lua_Integer)");
        }
        goto LAB_001120f2;
      }
    }
    else {
      io1 = (TValue *)0x0;
    }
    pTVar1 = L->top;
    (pTVar1->value_).i = n;
    pTVar1->tt_ = 0x13;
    L->top = L->top + 1;
    if (L->ci->top < L->top) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2b1,"int lua_geti(lua_State *, int, lua_Integer)");
    }
    luaV_finishget(L,t_00,L->top + -1,L->top + -1,io1);
  }
  else {
    if ((t_00->tt_ != 0x8015) && (t_00->tt_ != 0x8025)) {
      __assert_fail("(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2b6,"int lua_geti(lua_State *, int, lua_Integer)");
    }
    if ((((t_00->value_).gc)->tt != '\x15') && (((t_00->value_).gc)->tt != '%')) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2b6,"int lua_geti(lua_State *, int, lua_Integer)");
    }
    p_Var2 = (t_00->value_).f;
    if (t_00->tt_ == 0x8025) {
      if ((long)(ulong)(*(int *)(p_Var2 + 0xc) - 1) < n) {
        L->top->tt_ = 0;
      }
      else {
        if (*(uint *)(p_Var2 + 0xc) <= (uint)n) {
          luaG_runerror(L,"array out of bounds");
        }
        pTVar1 = L->top;
        pTVar1->value_ = *(Value *)(*(long *)(p_Var2 + 0x30) + (n & 0xffffffffU) * 8);
        pTVar1->tt_ = 3;
      }
    }
    else if ((long)(ulong)(*(int *)(p_Var2 + 0xc) - 1) < n) {
      L->top->tt_ = 0;
    }
    else {
      if (*(uint *)(p_Var2 + 0xc) <= (uint)n) {
        luaG_runerror(L,"array out of bounds");
      }
      pTVar1 = L->top;
      pTVar1->value_ = *(Value *)(*(long *)(p_Var2 + 0x30) + (n & 0xffffffffU) * 8);
      pTVar1->tt_ = 0x13;
    }
    L->top = L->top + 1;
    if (L->ci->top < L->top) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2c3,"int lua_geti(lua_State *, int, lua_Integer)");
    }
  }
LAB_001120f2:
  iVar3 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar3;
  if (iVar3 == 0) {
    return L->top[-1].tt_ & 0xf;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x2c5,"int lua_geti(lua_State *, int, lua_Integer)");
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  t = index2addr(L, idx);
  if (ttisLtable(t) || !ttistable(t)) {
    if (luaV_fastgeti(L, t, n, slot)) {
      setobj2s(L, L->top, slot);
      api_incr_top(L);
    }
    else {
      setivalue(L->top, n);
      api_incr_top(L);
      luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
    }
  }
  else {
    RaviArray *h = arrvalue(t);
    if (ttisfarray(t)) {
      if (n <= raviH_getn(h)) { raviH_get_float_inline(L, h, n, L->top); }
      else {
        setnilvalue(L->top);
      }
    }
    else {
      if (n <= raviH_getn(h)) { raviH_get_int_inline(L, h, n, L->top); }
      else {
        setnilvalue(L->top);
      }
    }
    api_incr_top(L);
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}